

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

size_t __thiscall
ktxValidator::validationContext::calcLevelOffset(validationContext *this,uint32_t level)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  float fVar7;
  
  if ((this->header).vkFormat == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2cd,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  if ((this->header).supercompressionScheme == 0) {
    if (level < this->levelCount) {
      uVar5 = (this->header).dataFormatDescriptor.byteLength;
      uVar1 = (this->header).keyValueData.byteLength;
      sVar6 = this->levelIndexSize;
      uVar2 = lcm4(this,(this->formatInfo).blockByteLength);
      fVar7 = ceilf((float)((ulong)uVar1 + uVar5 + sVar6 + 0x50) / (float)uVar2);
      fVar7 = fVar7 * (float)uVar2;
      uVar3 = (ulong)fVar7;
      sVar6 = (long)(fVar7 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
      uVar5 = this->levelCount;
      while (uVar5 = uVar5 - 1, level < uVar5) {
        sVar4 = calcLevelSize(this,uVar5);
        uVar2 = lcm4(this,(this->formatInfo).blockByteLength);
        fVar7 = ceilf((float)sVar4 / (float)uVar2);
        fVar7 = fVar7 * (float)uVar2;
        uVar3 = (ulong)fVar7;
        sVar6 = sVar6 + ((long)(fVar7 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3);
      }
      return sVar6;
    }
    __assert_fail("level < levelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2d0,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                ,0x2ce,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
}

Assistant:

size_t calcLevelOffset(uint32_t level) {
            // This function is only useful when the following 2 conditions
            // are met as otherwise we have no idea what the size of a level
            // ought to be.
            assert (header.vkFormat != VK_FORMAT_UNDEFINED);
            assert (header.supercompressionScheme == KTX_SS_NONE);

            assert (level < levelCount);
            // Calculate the expected base offset in the file
            size_t levelOffset = kvDataEndOffset();
            levelOffset
                  = padn(lcm4(formatInfo.blockByteLength), levelOffset);
            for (uint32_t i = levelCount - 1; i > level; i--) {
                size_t levelSize;
                levelSize = calcLevelSize(i);
                levelOffset
                    += padn(lcm4(formatInfo.blockByteLength), levelSize);
            }
            return levelOffset;
        }